

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suite_info.hpp
# Opt level: O2

string * __thiscall
beast::unit_test::suite_info::full_name_abi_cxx11_(string *__return_storage_ptr__,suite_info *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ::std::operator+(&local_38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &this->library_,".");
  ::std::operator+(&bStack_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38,
                   &this->module_);
  ::std::operator+(&local_58,&bStack_78,".");
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,&local_58,&this->name_);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&bStack_78);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string
    full_name() const
    {
        return library_ + "." + module_ + "." + name_;
    }